

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

ostream * pstd::operator<<(ostream *os,optional<pbrt::Point2<int>_> *opt)

{
  bool bVar1;
  ostream *poVar2;
  Point2<int> *v;
  char *pcVar3;
  
  bVar1 = opt->set;
  poVar2 = std::operator<<(os,"[ pstd::optional<");
  poVar2 = std::operator<<(poVar2,"N4pbrt6Point2IiEE");
  if (bVar1 == true) {
    poVar2 = std::operator<<(poVar2,"> set: true ");
    poVar2 = std::operator<<(poVar2,"value: ");
    v = optional<pbrt::Point2<int>_>::value(opt);
    poVar2 = pbrt::operator<<(poVar2,v);
    pcVar3 = " ]";
  }
  else {
    pcVar3 = "> set: false value: n/a ]";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  return poVar2;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}